

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  ulong uVar1;
  NodeRef *pNVar2;
  float *pfVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined4 uVar23;
  NodeRef nodeRef;
  undefined1 *puVar24;
  ulong uVar25;
  RTCRayQueryContext RVar26;
  RTCIntersectFunctionN p_Var27;
  RTCRayQueryContext *pRVar28;
  RTCRayQueryContext *pRVar29;
  RTCRayQueryContext *pRVar30;
  uint uVar31;
  RTCRayQueryContext *pRVar32;
  RTCRayQueryContext *pRVar33;
  RTCRayQueryContext RVar34;
  RTCRayQueryContext RVar35;
  ulong uVar36;
  RTCRayQueryContext RVar37;
  NodeRef *pNVar38;
  RTCRayQueryContext RVar39;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar40;
  ulong uVar41;
  bool bVar42;
  bool bVar43;
  float fVar44;
  undefined4 uVar45;
  float fVar90;
  float fVar92;
  vint4 bi;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar93;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined4 uVar91;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined4 uVar94;
  undefined4 uVar105;
  uint uVar106;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  uint uVar107;
  uint uVar108;
  uint uVar109;
  undefined1 auVar104 [16];
  float fVar110;
  uint uVar111;
  float fVar116;
  uint uVar117;
  float fVar118;
  uint uVar119;
  vint4 bi_1;
  undefined1 auVar112 [16];
  float fVar120;
  undefined1 auVar113 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar114;
  undefined1 auVar115 [16];
  uint uVar121;
  float fVar122;
  float fVar128;
  float fVar129;
  undefined1 in_XMM3 [16];
  vint4 ai;
  undefined1 auVar123 [16];
  float fVar130;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  vint4 ai_1;
  undefined1 auVar134 [16];
  float fVar144;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  vint4 ai_3;
  undefined1 auVar148 [16];
  float fVar153;
  uint uVar159;
  uint uVar160;
  vint4 bi_2;
  undefined1 auVar154 [16];
  uint uVar161;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar162;
  float fVar166;
  float fVar167;
  vint4 bi_3;
  float fVar168;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar169;
  uint uVar170;
  float fVar172;
  uint uVar173;
  float fVar174;
  uint uVar175;
  vint4 ai_2;
  undefined1 auVar171 [16];
  float fVar176;
  uint uVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  int iVar182;
  int iVar183;
  int iVar184;
  int iVar185;
  float fVar186;
  float fVar188;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar187;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  vint4 bi_8;
  undefined1 local_17f8 [16];
  RTCIntersectFunctionNArguments local_17d0;
  Geometry *local_17a0;
  undefined8 local_1798;
  RTCIntersectArguments *local_1790;
  uint local_1788;
  uint uStack_1784;
  uint uStack_1780;
  uint uStack_177c;
  float local_1778;
  float fStack_1774;
  float fStack_1770;
  float fStack_176c;
  float local_1768;
  float fStack_1764;
  float fStack_1760;
  float fStack_175c;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1758;
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  undefined1 local_1738 [16];
  undefined1 local_1728 [16];
  undefined8 local_1718;
  undefined8 uStack_1710;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  undefined1 local_16f8 [8];
  float fStack_16f0;
  float fStack_16ec;
  vint<4> mask;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar86 [16];
  undefined1 auVar103 [16];
  
  stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack_node[1].ptr == 8) {
    return;
  }
  fVar189 = (float)DAT_01ff1d40;
  fVar190 = DAT_01ff1d40._4_4_;
  fVar191 = DAT_01ff1d40._8_4_;
  fVar192 = DAT_01ff1d40._12_4_;
  if ((context->user != (RTCRayQueryContext *)0x0) &&
     ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
    auVar112._0_4_ = -(uint)((valid_i->field_0).i[0] == -1);
    auVar112._4_4_ = -(uint)((valid_i->field_0).i[1] == -1);
    auVar112._8_4_ = -(uint)((valid_i->field_0).i[2] == -1);
    auVar112._12_4_ = -(uint)((valid_i->field_0).i[3] == -1);
    uVar31 = movmskps((int)stack_node[1].ptr,auVar112);
    if (uVar31 == 0) {
      return;
    }
    stack_node[0xbc].ptr._0_4_ = (valid_i->field_0).i[0];
    stack_node[0xbc].ptr._4_4_ = (valid_i->field_0).i[1];
    stack_node[0xbd].ptr._0_4_ = (valid_i->field_0).i[2];
    stack_node[0xbd].ptr._4_4_ = (valid_i->field_0).i[3];
    stack_node[0xa6].ptr = (size_t)This->ptr;
    stack_node[0xa7].ptr = (size_t)(uVar31 & 0xff);
    fVar178 = *(float *)ray;
    fVar179 = *(float *)(ray + 4);
    fVar180 = *(float *)(ray + 8);
    fVar181 = *(float *)(ray + 0xc);
    fVar169 = *(float *)(ray + 0x10);
    fVar172 = *(float *)(ray + 0x14);
    fVar174 = *(float *)(ray + 0x18);
    fVar176 = *(float *)(ray + 0x1c);
    auVar148 = *(undefined1 (*) [16])(ray + 0x40);
    auVar134._4_4_ = -(uint)(ABS(auVar148._4_4_) < fVar190);
    auVar134._0_4_ = -(uint)(ABS(auVar148._0_4_) < fVar189);
    auVar134._8_4_ = -(uint)(ABS(auVar148._8_4_) < fVar191);
    auVar134._12_4_ = -(uint)(ABS(auVar148._12_4_) < fVar192);
    auVar135 = blendvps(auVar148,_DAT_01ff1d40,auVar134);
    fVar168 = *(float *)(ray + 0x20);
    fVar93 = *(float *)(ray + 0x24);
    fVar44 = *(float *)(ray + 0x28);
    fVar120 = *(float *)(ray + 0x2c);
    auVar123 = *(undefined1 (*) [16])(ray + 0x50);
    auVar154._4_4_ = -(uint)(ABS(auVar123._4_4_) < fVar190);
    auVar154._0_4_ = -(uint)(ABS(auVar123._0_4_) < fVar189);
    auVar154._8_4_ = -(uint)(ABS(auVar123._8_4_) < fVar191);
    auVar154._12_4_ = -(uint)(ABS(auVar123._12_4_) < fVar192);
    auVar154 = blendvps(auVar123,_DAT_01ff1d40,auVar154);
    auVar123 = *(undefined1 (*) [16])(ray + 0x60);
    auVar171._4_4_ = -(uint)(ABS(auVar123._4_4_) < fVar190);
    auVar171._0_4_ = -(uint)(ABS(auVar123._0_4_) < fVar189);
    auVar171._8_4_ = -(uint)(ABS(auVar123._8_4_) < fVar191);
    auVar171._12_4_ = -(uint)(ABS(auVar123._12_4_) < fVar192);
    auVar156 = blendvps(auVar123,_DAT_01ff1d40,auVar171);
    auVar134 = rcpps(auVar171,auVar135);
    fVar189 = auVar134._0_4_;
    fVar190 = auVar134._4_4_;
    fVar191 = auVar134._8_4_;
    fVar192 = auVar134._12_4_;
    fVar186 = (1.0 - auVar135._0_4_ * fVar189) * fVar189 + fVar189;
    fVar188 = (1.0 - auVar135._4_4_ * fVar190) * fVar190 + fVar190;
    auVar123._0_8_ = CONCAT44(fVar188,fVar186);
    auVar123._8_4_ = (1.0 - auVar135._8_4_ * fVar191) * fVar191 + fVar191;
    auVar123._12_4_ = (1.0 - auVar135._12_4_ * fVar192) * fVar192 + fVar192;
    auVar134 = rcpps(auVar134,auVar154);
    fVar90 = auVar134._0_4_;
    fVar92 = auVar134._4_4_;
    fVar110 = auVar134._8_4_;
    fVar116 = auVar134._12_4_;
    fVar90 = (1.0 - auVar154._0_4_ * fVar90) * fVar90 + fVar90;
    fVar92 = (1.0 - auVar154._4_4_ * fVar92) * fVar92 + fVar92;
    fVar110 = (1.0 - auVar154._8_4_ * fVar110) * fVar110 + fVar110;
    fVar116 = (1.0 - auVar154._12_4_ * fVar116) * fVar116 + fVar116;
    auVar134 = rcpps(auVar134,auVar156);
    fVar189 = auVar134._0_4_;
    fVar190 = auVar134._4_4_;
    fVar191 = auVar134._8_4_;
    fVar192 = auVar134._12_4_;
    fVar189 = (1.0 - auVar156._0_4_ * fVar189) * fVar189 + fVar189;
    fVar190 = (1.0 - auVar156._4_4_ * fVar190) * fVar190 + fVar190;
    fVar191 = (1.0 - auVar156._8_4_ * fVar191) * fVar191 + fVar191;
    fVar192 = (1.0 - auVar156._12_4_ * fVar192) * fVar192 + fVar192;
    auVar124._0_12_ = ZEXT812(0);
    auVar124._12_4_ = 0;
    stack_node._1392_16_ = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar124);
    auVar134 = maxps(*(undefined1 (*) [16])(ray + 0x80),auVar124);
    stack_node[0xbe].ptr = auVar134._0_8_;
    stack_node[0xbf].ptr = auVar134._8_8_;
    auVar115._0_8_ =
         CONCAT44(-(uint)(auVar148._4_4_ < 0.0),-(uint)(auVar148._0_4_ < 0.0)) & 0x100000001;
    auVar115._8_4_ = -(uint)(auVar148._8_4_ < 0.0) & 1;
    auVar115._12_4_ = -(uint)(auVar148._12_4_ < 0.0) & 1;
    auVar148._8_4_ = 0xffffffff;
    auVar148._0_8_ = 0xffffffffffffffff;
    auVar148._12_4_ = 0xffffffff;
    auVar156 = auVar112 ^ auVar148;
    auVar135._0_8_ =
         CONCAT44(-(uint)(*(float *)(ray + 0x54) < 0.0),-(uint)(*(float *)(ray + 0x50) < 0.0)) &
         0x200000002;
    auVar135._8_4_ = -(uint)(*(float *)(ray + 0x58) < 0.0) & 2;
    auVar135._12_4_ = -(uint)(*(float *)(ray + 0x5c) < 0.0) & 2;
    auVar164._0_8_ =
         CONCAT44(-(uint)(*(float *)(ray + 100) < 0.0),-(uint)(*(float *)(ray + 0x60) < 0.0)) &
         0x400000004;
    auVar164._8_4_ = -(uint)(*(float *)(ray + 0x68) < 0.0) & 4;
    auVar164._12_4_ = -(uint)(*(float *)(ray + 0x6c) < 0.0) & 4;
    auVar112 = auVar164 | auVar156 | auVar135 | auVar115;
    stack_node[0xb0].ptr = auVar112._0_8_;
    stack_node[0xb1].ptr = auVar112._8_8_;
    stack_node[0xce].ptr = mm_lookupmask_ps._0_8_;
    stack_node[0xcf].ptr = mm_lookupmask_ps._8_8_;
    stack_node[0xca].ptr._0_4_ = fVar178;
    stack_node[0xca].ptr._4_4_ = fVar179;
    stack_node[0xcb].ptr._0_4_ = fVar180;
    stack_node[0xcb].ptr._4_4_ = fVar181;
    stack_node[200].ptr._0_4_ = fVar169;
    stack_node[200].ptr._4_4_ = fVar172;
    stack_node[0xc9].ptr._0_4_ = fVar174;
    stack_node[0xc9].ptr._4_4_ = fVar176;
    stack_node[0xc6].ptr._0_4_ = fVar168;
    stack_node[0xc6].ptr._4_4_ = fVar93;
    stack_node[199].ptr._0_4_ = fVar44;
    stack_node[199].ptr._4_4_ = fVar120;
    stack_node[0xc4].ptr._0_4_ = fVar189;
    stack_node[0xc4].ptr._4_4_ = fVar190;
    stack_node[0xc5].ptr._0_4_ = fVar191;
    stack_node[0xc5].ptr._4_4_ = fVar192;
    stack_node[0xc2].ptr = auVar123._0_8_;
    stack_node[0xc3].ptr = auVar123._8_8_;
    stack_node[0xc0].ptr._0_4_ = fVar90;
    stack_node[0xc0].ptr._4_4_ = fVar92;
    stack_node[0xc1].ptr._0_4_ = fVar110;
    stack_node[0xc1].ptr._4_4_ = fVar116;
    stack_node[0xa8].ptr = (size_t)context;
    stack_node[0xa9].ptr = (size_t)ray;
LAB_002ac870:
    lVar4 = 0;
    if (stack_node[0xa7].ptr != 0) {
      for (; (stack_node[0xa7].ptr >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
      }
    }
    iVar182 = *(int *)((long)&stack_node[0xb0].ptr + lVar4 * 4);
    stack_node[0x9c].ptr._0_4_ = -(uint)(iVar182 == (int)stack_node[0xb0].ptr);
    stack_node[0x9c].ptr._4_4_ = -(uint)(iVar182 == stack_node[0xb0].ptr._4_4_);
    stack_node[0x9d].ptr._0_4_ = -(uint)(iVar182 == (int)stack_node[0xb1].ptr);
    stack_node[0x9d].ptr._4_4_ = -(uint)(iVar182 == stack_node[0xb1].ptr._4_4_);
    auVar10._4_4_ = stack_node[0x9c].ptr._4_4_;
    auVar10._0_4_ = (uint)stack_node[0x9c].ptr;
    auVar10._8_4_ = (uint)stack_node[0x9d].ptr;
    auVar10._12_4_ = stack_node[0x9d].ptr._4_4_;
    uVar23 = movmskps((int)lVar4,auVar10);
    uVar36 = CONCAT44((int)((ulong)lVar4 >> 0x20),uVar23);
    stack_node[0xab].ptr = ~uVar36 & stack_node[0xa7].ptr;
    auVar57._4_4_ = stack_node[0x9c].ptr._4_4_;
    auVar57._0_4_ = (uint)stack_node[0x9c].ptr;
    auVar57._8_4_ = (uint)stack_node[0x9d].ptr;
    auVar57._12_4_ = stack_node[0x9d].ptr._4_4_;
    auVar112 = blendvps((undefined1  [16])_DAT_01feb9f0,auVar123,auVar57);
    auVar58._4_4_ = auVar112._0_4_;
    auVar58._0_4_ = auVar112._4_4_;
    auVar58._8_4_ = auVar112._12_4_;
    auVar58._12_4_ = auVar112._8_4_;
    auVar112 = minps(auVar58,auVar112);
    auVar157._0_8_ = auVar112._8_8_;
    auVar157._8_4_ = auVar112._0_4_;
    auVar157._12_4_ = auVar112._4_4_;
    auVar148 = minps(auVar157,auVar112);
    auVar59._4_4_ = stack_node[0x9c].ptr._4_4_;
    auVar59._0_4_ = (uint)stack_node[0x9c].ptr;
    auVar59._8_4_ = (uint)stack_node[0x9d].ptr;
    auVar59._12_4_ = stack_node[0x9d].ptr._4_4_;
    auVar21._4_4_ = fVar92;
    auVar21._0_4_ = fVar90;
    auVar21._8_4_ = fVar110;
    auVar21._12_4_ = fVar116;
    auVar112 = blendvps((undefined1  [16])_DAT_01feb9f0,auVar21,auVar59);
    auVar60._4_4_ = auVar112._0_4_;
    auVar60._0_4_ = auVar112._4_4_;
    auVar60._8_4_ = auVar112._12_4_;
    auVar60._12_4_ = auVar112._8_4_;
    auVar112 = minps(auVar60,auVar112);
    auVar97._0_8_ = auVar112._8_8_;
    auVar97._8_4_ = auVar112._0_4_;
    auVar97._12_4_ = auVar112._4_4_;
    auVar112 = minps(auVar97,auVar112);
    auVar148 = insertps(auVar148,auVar112,0x1c);
    auVar61._4_4_ = stack_node[0x9c].ptr._4_4_;
    auVar61._0_4_ = (uint)stack_node[0x9c].ptr;
    auVar61._8_4_ = (uint)stack_node[0x9d].ptr;
    auVar61._12_4_ = stack_node[0x9d].ptr._4_4_;
    auVar19._4_4_ = fVar190;
    auVar19._0_4_ = fVar189;
    auVar19._8_4_ = fVar191;
    auVar19._12_4_ = fVar192;
    auVar112 = blendvps((undefined1  [16])_DAT_01feb9f0,auVar19,auVar61);
    auVar62._4_4_ = auVar112._0_4_;
    auVar62._0_4_ = auVar112._4_4_;
    auVar62._8_4_ = auVar112._12_4_;
    auVar62._12_4_ = auVar112._8_4_;
    auVar112 = minps(auVar62,auVar112);
    auVar98._0_8_ = auVar112._8_8_;
    auVar98._8_4_ = auVar112._0_4_;
    auVar98._12_4_ = auVar112._4_4_;
    auVar112 = minps(auVar98,auVar112);
    auVar135 = insertps(auVar148,auVar112,0x20);
    auVar63._4_4_ = stack_node[0x9c].ptr._4_4_;
    auVar63._0_4_ = (uint)stack_node[0x9c].ptr;
    auVar63._8_4_ = (uint)stack_node[0x9d].ptr;
    auVar63._12_4_ = stack_node[0x9d].ptr._4_4_;
    auVar112 = blendvps(_DAT_01feba00,auVar123,auVar63);
    auVar64._4_4_ = auVar112._0_4_;
    auVar64._0_4_ = auVar112._4_4_;
    auVar64._8_4_ = auVar112._12_4_;
    auVar64._12_4_ = auVar112._8_4_;
    auVar112 = maxps(auVar64,auVar112);
    auVar99._0_8_ = auVar112._8_8_;
    auVar99._8_4_ = auVar112._0_4_;
    auVar99._12_4_ = auVar112._4_4_;
    auVar148 = maxps(auVar99,auVar112);
    auVar65._4_4_ = stack_node[0x9c].ptr._4_4_;
    auVar65._0_4_ = (uint)stack_node[0x9c].ptr;
    auVar65._8_4_ = (uint)stack_node[0x9d].ptr;
    auVar65._12_4_ = stack_node[0x9d].ptr._4_4_;
    auVar22._4_4_ = fVar92;
    auVar22._0_4_ = fVar90;
    auVar22._8_4_ = fVar110;
    auVar22._12_4_ = fVar116;
    auVar112 = blendvps(_DAT_01feba00,auVar22,auVar65);
    auVar66._4_4_ = auVar112._0_4_;
    auVar66._0_4_ = auVar112._4_4_;
    auVar66._8_4_ = auVar112._12_4_;
    auVar66._12_4_ = auVar112._8_4_;
    auVar112 = maxps(auVar66,auVar112);
    auVar100._0_8_ = auVar112._8_8_;
    auVar100._8_4_ = auVar112._0_4_;
    auVar100._12_4_ = auVar112._4_4_;
    auVar112 = maxps(auVar100,auVar112);
    auVar148 = insertps(auVar148,auVar112,0x1c);
    auVar67._4_4_ = stack_node[0x9c].ptr._4_4_;
    auVar67._0_4_ = (uint)stack_node[0x9c].ptr;
    auVar67._8_4_ = (uint)stack_node[0x9d].ptr;
    auVar67._12_4_ = stack_node[0x9d].ptr._4_4_;
    auVar20._4_4_ = fVar190;
    auVar20._0_4_ = fVar189;
    auVar20._8_4_ = fVar191;
    auVar20._12_4_ = fVar192;
    auVar112 = blendvps(_DAT_01feba00,auVar20,auVar67);
    auVar68._4_4_ = auVar112._0_4_;
    auVar68._0_4_ = auVar112._4_4_;
    auVar68._8_4_ = auVar112._12_4_;
    auVar68._12_4_ = auVar112._8_4_;
    auVar112 = maxps(auVar68,auVar112);
    auVar101._0_8_ = auVar112._8_8_;
    auVar101._8_4_ = auVar112._0_4_;
    auVar101._12_4_ = auVar112._4_4_;
    auVar112 = maxps(auVar101,auVar112);
    auVar134 = insertps(auVar148,auVar112,0x20);
    auVar69._4_4_ = -(uint)(0.0 <= auVar135._4_4_);
    auVar69._0_4_ = -(uint)(0.0 <= auVar135._0_4_);
    auVar69._8_4_ = -(uint)(0.0 <= auVar135._8_4_);
    auVar69._12_4_ = -(uint)(0.0 <= auVar135._12_4_);
    auVar112 = blendvps(auVar134,auVar135,auVar69);
    stack_node[0xdc].ptr._0_4_ = auVar112._4_4_;
    stack_node[0xad].ptr = (ulong)((float)stack_node[0xdc].ptr < 0.0) << 4 | 0x20;
    fVar118 = auVar112._8_4_;
    stack_node[0xec].ptr = *(size_t *)(stack_node[0xa6].ptr + 0x70);
    stack_node[0xed].ptr = uVar36;
    uVar41 = (ulong)(fVar118 < 0.0) << 4 | 0x40;
    stack_node[0xac].ptr = stack_node[0xad].ptr ^ 0x10;
    stack_node[0xe0].ptr._0_4_ = auVar112._0_4_;
    auVar70._4_4_ = stack_node[0x9c].ptr._4_4_;
    auVar70._0_4_ = (uint)stack_node[0x9c].ptr;
    auVar70._8_4_ = (uint)stack_node[0x9d].ptr;
    auVar70._12_4_ = stack_node[0x9d].ptr._4_4_;
    auVar13._4_4_ = fVar179;
    auVar13._0_4_ = fVar178;
    auVar13._8_4_ = fVar180;
    auVar13._12_4_ = fVar181;
    auVar112 = blendvps((undefined1  [16])_DAT_01feb9f0,auVar13,auVar70);
    auVar71._4_4_ = auVar112._0_4_;
    auVar71._0_4_ = auVar112._4_4_;
    auVar71._8_4_ = auVar112._12_4_;
    auVar71._12_4_ = auVar112._8_4_;
    auVar112 = minps(auVar71,auVar112);
    auVar102._0_8_ = auVar112._8_8_;
    auVar102._8_4_ = auVar112._0_4_;
    auVar102._12_4_ = auVar112._4_4_;
    auVar148 = minps(auVar102,auVar112);
    auVar72._4_4_ = stack_node[0x9c].ptr._4_4_;
    auVar72._0_4_ = (uint)stack_node[0x9c].ptr;
    auVar72._8_4_ = (uint)stack_node[0x9d].ptr;
    auVar72._12_4_ = stack_node[0x9d].ptr._4_4_;
    auVar15._4_4_ = fVar172;
    auVar15._0_4_ = fVar169;
    auVar15._8_4_ = fVar174;
    auVar15._12_4_ = fVar176;
    auVar112 = blendvps((undefined1  [16])_DAT_01feb9f0,auVar15,auVar72);
    auVar73._4_4_ = auVar112._0_4_;
    auVar73._0_4_ = auVar112._4_4_;
    auVar73._8_4_ = auVar112._12_4_;
    auVar73._12_4_ = auVar112._8_4_;
    auVar112 = minps(auVar73,auVar112);
    auVar125._0_8_ = auVar112._8_8_;
    auVar125._8_4_ = auVar112._0_4_;
    auVar125._12_4_ = auVar112._4_4_;
    auVar112 = minps(auVar125,auVar112);
    auVar74._4_4_ = stack_node[0x9c].ptr._4_4_;
    auVar74._0_4_ = (uint)stack_node[0x9c].ptr;
    auVar74._8_4_ = (uint)stack_node[0x9d].ptr;
    auVar74._12_4_ = stack_node[0x9d].ptr._4_4_;
    auVar17._4_4_ = fVar93;
    auVar17._0_4_ = fVar168;
    auVar17._8_4_ = fVar44;
    auVar17._12_4_ = fVar120;
    auVar154 = blendvps((undefined1  [16])_DAT_01feb9f0,auVar17,auVar74);
    auVar148 = insertps(auVar148,auVar112,0x1c);
    auVar75._4_4_ = auVar154._0_4_;
    auVar75._0_4_ = auVar154._4_4_;
    auVar75._8_4_ = auVar154._12_4_;
    auVar75._12_4_ = auVar154._8_4_;
    auVar112 = minps(auVar75,auVar154);
    auVar126._0_8_ = auVar112._8_8_;
    auVar126._8_4_ = auVar112._0_4_;
    auVar126._12_4_ = auVar112._4_4_;
    auVar112 = minps(auVar126,auVar112);
    auVar148 = insertps(auVar148,auVar112,0x20);
    auVar76._4_4_ = stack_node[0x9c].ptr._4_4_;
    auVar76._0_4_ = (uint)stack_node[0x9c].ptr;
    auVar76._8_4_ = (uint)stack_node[0x9d].ptr;
    auVar76._12_4_ = stack_node[0x9d].ptr._4_4_;
    auVar14._4_4_ = fVar179;
    auVar14._0_4_ = fVar178;
    auVar14._8_4_ = fVar180;
    auVar14._12_4_ = fVar181;
    auVar112 = blendvps(_DAT_01feba00,auVar14,auVar76);
    auVar77._4_4_ = auVar112._0_4_;
    auVar77._0_4_ = auVar112._4_4_;
    auVar77._8_4_ = auVar112._12_4_;
    auVar77._12_4_ = auVar112._8_4_;
    auVar112 = maxps(auVar77,auVar112);
    auVar127._0_8_ = auVar112._8_8_;
    auVar127._8_4_ = auVar112._0_4_;
    auVar127._12_4_ = auVar112._4_4_;
    auVar154 = maxps(auVar127,auVar112);
    auVar78._4_4_ = stack_node[0x9c].ptr._4_4_;
    auVar78._0_4_ = (uint)stack_node[0x9c].ptr;
    auVar78._8_4_ = (uint)stack_node[0x9d].ptr;
    auVar78._12_4_ = stack_node[0x9d].ptr._4_4_;
    auVar16._4_4_ = fVar172;
    auVar16._0_4_ = fVar169;
    auVar16._8_4_ = fVar174;
    auVar16._12_4_ = fVar176;
    auVar112 = blendvps(_DAT_01feba00,auVar16,auVar78);
    auVar79._4_4_ = auVar112._0_4_;
    auVar79._0_4_ = auVar112._4_4_;
    auVar79._8_4_ = auVar112._12_4_;
    auVar79._12_4_ = auVar112._8_4_;
    auVar112 = maxps(auVar79,auVar112);
    auVar136._0_8_ = auVar112._8_8_;
    auVar136._8_4_ = auVar112._0_4_;
    auVar136._12_4_ = auVar112._4_4_;
    auVar112 = maxps(auVar136,auVar112);
    auVar80._4_4_ = stack_node[0x9c].ptr._4_4_;
    auVar80._0_4_ = (uint)stack_node[0x9c].ptr;
    auVar80._8_4_ = (uint)stack_node[0x9d].ptr;
    auVar80._12_4_ = stack_node[0x9d].ptr._4_4_;
    auVar18._4_4_ = fVar93;
    auVar18._0_4_ = fVar168;
    auVar18._8_4_ = fVar44;
    auVar18._12_4_ = fVar120;
    auVar171 = blendvps(_DAT_01feba00,auVar18,auVar80);
    auVar154 = insertps(auVar154,auVar112,0x1c);
    auVar81._4_4_ = auVar171._0_4_;
    auVar81._0_4_ = auVar171._4_4_;
    auVar81._8_4_ = auVar171._12_4_;
    auVar81._12_4_ = auVar171._8_4_;
    auVar112 = maxps(auVar81,auVar171);
    auVar137._0_8_ = auVar112._8_8_;
    auVar137._8_4_ = auVar112._0_4_;
    auVar137._12_4_ = auVar112._4_4_;
    auVar112 = maxps(auVar137,auVar112);
    auVar112 = insertps(auVar154,auVar112,0x20);
    auVar171 = blendvps(auVar112,auVar148,auVar69);
    auVar112 = blendvps(auVar148,auVar112,auVar69);
    auVar82._4_4_ = stack_node[0x9c].ptr._4_4_;
    auVar82._0_4_ = (uint)stack_node[0x9c].ptr;
    auVar82._8_4_ = (uint)stack_node[0x9d].ptr;
    auVar82._12_4_ = stack_node[0x9d].ptr._4_4_;
    stack_node._1312_16_ = blendvps(_DAT_01feba00,stack_node._1520_16_,auVar82);
    auVar138._4_4_ = (int)stack_node[0xa4].ptr;
    auVar138._0_4_ = stack_node[0xa4].ptr._4_4_;
    auVar138._8_4_ = stack_node[0xa5].ptr._4_4_;
    auVar138._12_4_ = (int)stack_node[0xa5].ptr;
    auVar154 = maxps(auVar138,stack_node._1312_16_);
    auVar148 = blendvps((undefined1  [16])_DAT_01feb9f0,stack_node._1392_16_,auVar82);
    auVar163._4_4_ = auVar148._0_4_;
    auVar163._0_4_ = auVar148._4_4_;
    auVar163._8_4_ = auVar148._12_4_;
    auVar163._12_4_ = auVar148._8_4_;
    auVar164 = minps(auVar163,auVar148);
    auVar148 = blendvps(auVar135,auVar134,auVar69);
    stack_node[0xde].ptr._0_4_ = auVar112._0_4_ * (float)stack_node[0xe0].ptr;
    stack_node[0xda].ptr._0_4_ = auVar112._4_4_ * (float)stack_node[0xdc].ptr;
    stack_node[0xe8].ptr._0_4_ = auVar112._8_4_ * fVar118;
    stack_node[0xd8].ptr._0_4_ = auVar148._0_4_;
    fVar122 = auVar171._0_4_ * (float)stack_node[0xd8].ptr;
    stack_node[0xd4].ptr._0_4_ = auVar148._4_4_;
    fVar128 = auVar171._4_4_ * (float)stack_node[0xd4].ptr;
    stack_node[0x9f].ptr._0_4_ = auVar148._8_4_;
    stack_node[0xe6].ptr._0_4_ = auVar171._8_4_ * (float)stack_node[0x9f].ptr;
    uVar25 = (ulong)((float)stack_node[0xe0].ptr < 0.0) * 0x10;
    stack_node[0xe0].ptr._4_4_ = (float)stack_node[0xe0].ptr;
    stack_node[0xe1].ptr._0_4_ = (float)stack_node[0xe0].ptr;
    stack_node[0xe1].ptr._4_4_ = (float)stack_node[0xe0].ptr;
    stack_node[0xde].ptr._4_4_ = (float)stack_node[0xde].ptr;
    stack_node[0xdf].ptr._0_4_ = (float)stack_node[0xde].ptr;
    stack_node[0xdf].ptr._4_4_ = (float)stack_node[0xde].ptr;
    stack_node[0xdc].ptr._4_4_ = (float)stack_node[0xdc].ptr;
    stack_node[0xdd].ptr._0_4_ = (float)stack_node[0xdc].ptr;
    stack_node[0xdd].ptr._4_4_ = (float)stack_node[0xdc].ptr;
    stack_node[0xda].ptr._4_4_ = (float)stack_node[0xda].ptr;
    stack_node[0xdb].ptr._0_4_ = (float)stack_node[0xda].ptr;
    stack_node[0xdb].ptr._4_4_ = (float)stack_node[0xda].ptr;
    stack_node[0xa0].ptr._4_4_ = fVar118;
    stack_node[0xa0].ptr._0_4_ = fVar118;
    stack_node[0xa1].ptr._0_4_ = fVar118;
    stack_node[0xa1].ptr._4_4_ = fVar118;
    stack_node[0xe8].ptr._4_4_ = (float)stack_node[0xe8].ptr;
    stack_node[0xe9].ptr._0_4_ = (float)stack_node[0xe8].ptr;
    stack_node[0xe9].ptr._4_4_ = (float)stack_node[0xe8].ptr;
    stack_node[0xd8].ptr._4_4_ = (float)stack_node[0xd8].ptr;
    stack_node[0xd9].ptr._0_4_ = (float)stack_node[0xd8].ptr;
    stack_node[0xd9].ptr._4_4_ = (float)stack_node[0xd8].ptr;
    auVar83._4_4_ = stack_node[0x9c].ptr._4_4_;
    auVar83._0_4_ = (uint)stack_node[0x9c].ptr;
    auVar83._8_4_ = (uint)stack_node[0x9d].ptr;
    auVar83._12_4_ = stack_node[0x9d].ptr._4_4_;
    stack_node._1296_16_ = blendvps((undefined1  [16])_DAT_01feb9f0,stack_node._1392_16_,auVar83);
    uVar105 = fVar122;
    uVar94 = fVar122;
    auVar103._0_8_ = CONCAT44(uVar105,uVar94);
    auVar103._8_4_ = fVar122;
    auVar103._12_4_ = fVar122;
    stack_node[0xd6].ptr = auVar103._0_8_;
    stack_node[0xd7].ptr = auVar103._8_8_;
    uVar23 = auVar164._0_4_;
    auVar165._8_4_ = auVar164._8_4_;
    auVar84._4_4_ = uVar23;
    auVar84._0_4_ = uVar23;
    auVar84._8_4_ = uVar23;
    auVar84._12_4_ = uVar23;
    auVar165._4_4_ = auVar165._8_4_;
    auVar165._0_4_ = auVar165._8_4_;
    auVar165._12_4_ = auVar165._8_4_;
    auVar112 = minps(auVar165,auVar84);
    stack_node[0xe2].ptr = auVar112._0_8_;
    stack_node[0xe3].ptr = auVar112._8_8_;
    uVar23 = auVar154._0_4_;
    auVar139._8_4_ = auVar154._8_4_;
    auVar85._4_4_ = uVar23;
    auVar85._0_4_ = uVar23;
    auVar85._8_4_ = uVar23;
    auVar85._12_4_ = uVar23;
    auVar139._4_4_ = auVar139._8_4_;
    auVar139._0_4_ = auVar139._8_4_;
    auVar139._12_4_ = auVar139._8_4_;
    auVar112 = maxps(auVar139,auVar85);
    stack_node[0xe4].ptr = auVar112._0_8_;
    stack_node[0xe5].ptr = auVar112._8_8_;
    stack_node[0xd4].ptr._4_4_ = (float)stack_node[0xd4].ptr;
    stack_node[0xd5].ptr._0_4_ = (float)stack_node[0xd4].ptr;
    stack_node[0xd5].ptr._4_4_ = (float)stack_node[0xd4].ptr;
    uVar91 = fVar128;
    uVar45 = fVar128;
    auVar86._0_8_ = CONCAT44(uVar91,uVar45);
    auVar86._8_4_ = fVar128;
    auVar86._12_4_ = fVar128;
    stack_node[0xd2].ptr = auVar86._0_8_;
    stack_node[0xd3].ptr = auVar86._8_8_;
    stack_node[0x9e].ptr._4_4_ = (float)stack_node[0x9f].ptr;
    stack_node[0x9e].ptr._0_4_ = (float)stack_node[0x9f].ptr;
    stack_node[0x9f].ptr._4_4_ = (float)stack_node[0x9f].ptr;
    stack_node[0xe6].ptr._4_4_ = (float)stack_node[0xe6].ptr;
    stack_node[0xe7].ptr._0_4_ = (float)stack_node[0xe6].ptr;
    stack_node[0xe7].ptr._4_4_ = (float)stack_node[0xe6].ptr;
    pRVar32 = (RTCRayQueryContext *)(stack_node + 0xee);
    stack_node[0xa7].ptr = stack_node[0xab].ptr;
LAB_002acc5f:
    RVar37.instID[0] = 8;
    RVar37.instPrimID[0] = 0;
    if (pRVar32 != (RTCRayQueryContext *)(stack_node + 0xec)) {
      pRVar30 = pRVar32 + -2;
      uVar23 = movmskps((int)uVar36,auVar156);
      RVar26 = (RTCRayQueryContext)(~CONCAT44((int)(uVar36 >> 0x20),uVar23) & (ulong)pRVar32[-1]);
      if (RVar26 != (RTCRayQueryContext)0x0) {
        RVar39 = *pRVar30;
        do {
          if (((ulong)RVar39 & 8) != 0) {
            if (RVar26 != (RTCRayQueryContext)0x0) {
              uVar36 = (ulong)(RVar39.instID[0] & 0xf) - 8;
              auVar112 = auVar156;
              if (uVar36 == 0) goto LAB_002ad024;
              auVar11._8_4_ = 0xffffffff;
              auVar11._0_8_ = 0xffffffffffffffff;
              auVar11._12_4_ = 0xffffffff;
              stack_node._1664_16_ = auVar156 ^ auVar11;
              stack_node[0xcc].ptr = auVar156._0_8_;
              stack_node[0xcd].ptr = auVar156._8_8_;
              stack_node[0xab].ptr = 1;
              stack_node[0xaa].ptr = uVar36;
              goto LAB_002acead;
            }
            break;
          }
          pfVar3 = (float *)((long)RVar39 + 0x20 + uVar25);
          fVar118 = *pfVar3 * (float)stack_node[0xe0].ptr - (float)stack_node[0xde].ptr;
          fVar122 = pfVar3[1] * stack_node[0xe0].ptr._4_4_ - stack_node[0xde].ptr._4_4_;
          fVar128 = pfVar3[2] * (float)stack_node[0xe1].ptr - (float)stack_node[0xdf].ptr;
          fVar129 = pfVar3[3] * stack_node[0xe1].ptr._4_4_ - stack_node[0xdf].ptr._4_4_;
          pfVar3 = (float *)((long)RVar39 + 0x20 + stack_node[0xad].ptr);
          fVar130 = *pfVar3 * (float)stack_node[0xdc].ptr - (float)stack_node[0xda].ptr;
          fVar132 = pfVar3[1] * stack_node[0xdc].ptr._4_4_ - stack_node[0xda].ptr._4_4_;
          fVar140 = pfVar3[2] * (float)stack_node[0xdd].ptr - (float)stack_node[0xdb].ptr;
          fVar142 = pfVar3[3] * stack_node[0xdd].ptr._4_4_ - stack_node[0xdb].ptr._4_4_;
          uVar170 = (uint)((int)fVar130 < (int)fVar118) * (int)fVar118 |
                    (uint)((int)fVar130 >= (int)fVar118) * (int)fVar130;
          uVar175 = (uint)((int)fVar132 < (int)fVar122) * (int)fVar122 |
                    (uint)((int)fVar132 >= (int)fVar122) * (int)fVar132;
          uVar106 = (uint)((int)fVar140 < (int)fVar128) * (int)fVar128 |
                    (uint)((int)fVar140 >= (int)fVar128) * (int)fVar140;
          uVar108 = (uint)((int)fVar142 < (int)fVar129) * (int)fVar129 |
                    (uint)((int)fVar142 >= (int)fVar129) * (int)fVar142;
          pfVar3 = (float *)((long)RVar39 + 0x20 + uVar41);
          fVar118 = *pfVar3 * (float)stack_node[0xa0].ptr - (float)stack_node[0xe8].ptr;
          fVar122 = pfVar3[1] * stack_node[0xa0].ptr._4_4_ - stack_node[0xe8].ptr._4_4_;
          fVar128 = pfVar3[2] * (float)stack_node[0xa1].ptr - (float)stack_node[0xe9].ptr;
          fVar129 = pfVar3[3] * stack_node[0xa1].ptr._4_4_ - stack_node[0xe9].ptr._4_4_;
          uVar31 = (uint)((int)fVar118 < (int)stack_node[0xe2].ptr) * (int)stack_node[0xe2].ptr |
                   (uint)((int)fVar118 >= (int)stack_node[0xe2].ptr) * (int)fVar118;
          uVar159 = (uint)((int)fVar122 < stack_node[0xe2].ptr._4_4_) * stack_node[0xe2].ptr._4_4_ |
                    (uint)((int)fVar122 >= stack_node[0xe2].ptr._4_4_) * (int)fVar122;
          uVar160 = (uint)((int)fVar128 < (int)stack_node[0xe3].ptr) * (int)stack_node[0xe3].ptr |
                    (uint)((int)fVar128 >= (int)stack_node[0xe3].ptr) * (int)fVar128;
          uVar161 = (uint)((int)fVar129 < stack_node[0xe3].ptr._4_4_) * stack_node[0xe3].ptr._4_4_ |
                    (uint)((int)fVar129 >= stack_node[0xe3].ptr._4_4_) * (int)fVar129;
          pfVar3 = (float *)((long)RVar39 + 0x20 + (uVar25 ^ 0x10));
          fVar118 = *pfVar3 * (float)stack_node[0xd8].ptr - (float)stack_node[0xd6].ptr;
          fVar122 = pfVar3[1] * stack_node[0xd8].ptr._4_4_ - stack_node[0xd6].ptr._4_4_;
          fVar128 = pfVar3[2] * (float)stack_node[0xd9].ptr - (float)stack_node[0xd7].ptr;
          fVar129 = pfVar3[3] * stack_node[0xd9].ptr._4_4_ - stack_node[0xd7].ptr._4_4_;
          pfVar3 = (float *)((long)RVar39 + 0x20 + stack_node[0xac].ptr);
          fVar130 = *pfVar3 * (float)stack_node[0xd4].ptr - (float)stack_node[0xd2].ptr;
          fVar132 = pfVar3[1] * stack_node[0xd4].ptr._4_4_ - stack_node[0xd2].ptr._4_4_;
          fVar140 = pfVar3[2] * (float)stack_node[0xd5].ptr - (float)stack_node[0xd3].ptr;
          fVar142 = pfVar3[3] * stack_node[0xd5].ptr._4_4_ - stack_node[0xd3].ptr._4_4_;
          uVar111 = (uint)((int)fVar118 < (int)fVar130) * (int)fVar118 |
                    (uint)((int)fVar118 >= (int)fVar130) * (int)fVar130;
          uVar117 = (uint)((int)fVar122 < (int)fVar132) * (int)fVar122 |
                    (uint)((int)fVar122 >= (int)fVar132) * (int)fVar132;
          uVar119 = (uint)((int)fVar128 < (int)fVar140) * (int)fVar128 |
                    (uint)((int)fVar128 >= (int)fVar140) * (int)fVar140;
          uVar121 = (uint)((int)fVar129 < (int)fVar142) * (int)fVar129 |
                    (uint)((int)fVar129 >= (int)fVar142) * (int)fVar142;
          pfVar3 = (float *)((long)RVar39 + 0x20 + (uVar41 ^ 0x10));
          fVar118 = *pfVar3 * (float)stack_node[0x9e].ptr - (float)stack_node[0xe6].ptr;
          fVar122 = pfVar3[1] * stack_node[0x9e].ptr._4_4_ - stack_node[0xe6].ptr._4_4_;
          fVar128 = pfVar3[2] * (float)stack_node[0x9f].ptr - (float)stack_node[0xe7].ptr;
          fVar129 = pfVar3[3] * stack_node[0x9f].ptr._4_4_ - stack_node[0xe7].ptr._4_4_;
          uVar173 = (uint)((int)stack_node[0xe4].ptr < (int)fVar118) * (int)stack_node[0xe4].ptr |
                    (uint)((int)stack_node[0xe4].ptr >= (int)fVar118) * (int)fVar118;
          uVar177 = (uint)(stack_node[0xe4].ptr._4_4_ < (int)fVar122) * stack_node[0xe4].ptr._4_4_ |
                    (uint)(stack_node[0xe4].ptr._4_4_ >= (int)fVar122) * (int)fVar122;
          uVar107 = (uint)((int)stack_node[0xe5].ptr < (int)fVar128) * (int)stack_node[0xe5].ptr |
                    (uint)((int)stack_node[0xe5].ptr >= (int)fVar128) * (int)fVar128;
          uVar109 = (uint)(stack_node[0xe5].ptr._4_4_ < (int)fVar129) * stack_node[0xe5].ptr._4_4_ |
                    (uint)(stack_node[0xe5].ptr._4_4_ >= (int)fVar129) * (int)fVar129;
          auVar87._4_4_ =
               -(uint)((float)(((int)uVar159 < (int)uVar175) * uVar175 |
                              ((int)uVar159 >= (int)uVar175) * uVar159) <=
                      (float)(((int)uVar117 < (int)uVar177) * uVar117 |
                             ((int)uVar117 >= (int)uVar177) * uVar177));
          auVar87._0_4_ =
               -(uint)((float)(((int)uVar31 < (int)uVar170) * uVar170 |
                              ((int)uVar31 >= (int)uVar170) * uVar31) <=
                      (float)(((int)uVar111 < (int)uVar173) * uVar111 |
                             ((int)uVar111 >= (int)uVar173) * uVar173));
          auVar87._8_4_ =
               -(uint)((float)(((int)uVar160 < (int)uVar106) * uVar106 |
                              ((int)uVar160 >= (int)uVar106) * uVar160) <=
                      (float)(((int)uVar119 < (int)uVar107) * uVar119 |
                             ((int)uVar119 >= (int)uVar107) * uVar107));
          auVar87._12_4_ =
               -(uint)((float)(((int)uVar161 < (int)uVar108) * uVar108 |
                              ((int)uVar161 >= (int)uVar108) * uVar161) <=
                      (float)(((int)uVar121 < (int)uVar109) * uVar121 |
                             ((int)uVar121 >= (int)uVar109) * uVar109));
          uVar31 = movmskps((int)stack_node[0xac].ptr,auVar87);
          if (uVar31 == 0) {
            pRVar32 = (RTCRayQueryContext *)0x0;
          }
          else {
            uVar36 = (ulong)(uVar31 & 0xff);
            RVar26.instID[0] = 0;
            RVar26.instPrimID[0] = 0;
            RVar34 = RVar37;
            do {
              lVar4 = 0;
              if (uVar36 != 0) {
                for (; (uVar36 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
                }
              }
              fVar118 = *(float *)((long)RVar39 + 0x20 + lVar4 * 4);
              fVar122 = *(float *)((long)RVar39 + 0x30 + lVar4 * 4);
              fVar128 = *(float *)((long)RVar39 + 0x40 + lVar4 * 4);
              fVar129 = *(float *)((long)RVar39 + 0x50 + lVar4 * 4);
              fVar146 = (fVar118 - fVar178) * auVar123._0_4_;
              fVar149 = (fVar118 - fVar179) * auVar123._4_4_;
              fVar151 = (fVar118 - fVar180) * auVar123._8_4_;
              fVar153 = (fVar118 - fVar181) * auVar123._12_4_;
              fVar162 = (fVar128 - fVar169) * fVar90;
              fVar166 = (fVar128 - fVar172) * fVar92;
              fVar167 = (fVar128 - fVar174) * fVar110;
              fVar131 = (fVar128 - fVar176) * fVar116;
              fVar118 = *(float *)((long)RVar39 + 0x60 + lVar4 * 4);
              fVar133 = (fVar118 - fVar168) * fVar189;
              fVar141 = (fVar118 - fVar93) * fVar190;
              fVar143 = (fVar118 - fVar44) * fVar191;
              fVar145 = (fVar118 - fVar120) * fVar192;
              fVar132 = (fVar122 - fVar178) * auVar123._0_4_;
              fVar140 = (fVar122 - fVar179) * auVar123._4_4_;
              fVar142 = (fVar122 - fVar180) * auVar123._8_4_;
              fVar144 = (fVar122 - fVar181) * auVar123._12_4_;
              fVar122 = (fVar129 - fVar169) * fVar90;
              fVar128 = (fVar129 - fVar172) * fVar92;
              fVar130 = (fVar129 - fVar174) * fVar110;
              fVar129 = (fVar129 - fVar176) * fVar116;
              fVar118 = *(float *)((long)RVar39 + 0x70 + lVar4 * 4);
              fVar147 = (fVar118 - fVar168) * fVar189;
              fVar150 = (fVar118 - fVar93) * fVar190;
              fVar152 = (fVar118 - fVar44) * fVar191;
              fVar118 = (fVar118 - fVar120) * fVar192;
              uVar31 = (uint)((int)fVar132 < (int)fVar146) * (int)fVar132 |
                       (uint)((int)fVar132 >= (int)fVar146) * (int)fVar146;
              uVar159 = (uint)((int)fVar140 < (int)fVar149) * (int)fVar140 |
                        (uint)((int)fVar140 >= (int)fVar149) * (int)fVar149;
              uVar160 = (uint)((int)fVar142 < (int)fVar151) * (int)fVar142 |
                        (uint)((int)fVar142 >= (int)fVar151) * (int)fVar151;
              uVar161 = (uint)((int)fVar144 < (int)fVar153) * (int)fVar144 |
                        (uint)((int)fVar144 >= (int)fVar153) * (int)fVar153;
              uVar170 = (uint)((int)fVar122 < (int)fVar162) * (int)fVar122 |
                        (uint)((int)fVar122 >= (int)fVar162) * (int)fVar162;
              uVar173 = (uint)((int)fVar128 < (int)fVar166) * (int)fVar128 |
                        (uint)((int)fVar128 >= (int)fVar166) * (int)fVar166;
              uVar175 = (uint)((int)fVar130 < (int)fVar167) * (int)fVar130 |
                        (uint)((int)fVar130 >= (int)fVar167) * (int)fVar167;
              uVar177 = (uint)((int)fVar129 < (int)fVar131) * (int)fVar129 |
                        (uint)((int)fVar129 >= (int)fVar131) * (int)fVar131;
              uVar111 = ((int)uVar170 < (int)uVar31) * uVar31 |
                        ((int)uVar170 >= (int)uVar31) * uVar170;
              uVar117 = ((int)uVar173 < (int)uVar159) * uVar159 |
                        ((int)uVar173 >= (int)uVar159) * uVar173;
              uVar119 = ((int)uVar175 < (int)uVar160) * uVar160 |
                        ((int)uVar175 >= (int)uVar160) * uVar175;
              uVar121 = ((int)uVar177 < (int)uVar161) * uVar161 |
                        ((int)uVar177 >= (int)uVar161) * uVar177;
              uVar31 = (uint)((int)fVar147 < (int)fVar133) * (int)fVar147 |
                       (uint)((int)fVar147 >= (int)fVar133) * (int)fVar133;
              uVar159 = (uint)((int)fVar150 < (int)fVar141) * (int)fVar150 |
                        (uint)((int)fVar150 >= (int)fVar141) * (int)fVar141;
              uVar160 = (uint)((int)fVar152 < (int)fVar143) * (int)fVar152 |
                        (uint)((int)fVar152 >= (int)fVar143) * (int)fVar143;
              uVar161 = (uint)((int)fVar118 < (int)fVar145) * (int)fVar118 |
                        (uint)((int)fVar118 >= (int)fVar145) * (int)fVar145;
              uVar106 = (uint)((int)uVar31 < (int)stack_node[0xa2].ptr) * (int)stack_node[0xa2].ptr
                        | ((int)uVar31 >= (int)stack_node[0xa2].ptr) * uVar31;
              uVar107 = (uint)((int)uVar159 < stack_node[0xa2].ptr._4_4_) *
                        stack_node[0xa2].ptr._4_4_ |
                        ((int)uVar159 >= stack_node[0xa2].ptr._4_4_) * uVar159;
              uVar108 = (uint)((int)uVar160 < (int)stack_node[0xa3].ptr) * (int)stack_node[0xa3].ptr
                        | ((int)uVar160 >= (int)stack_node[0xa3].ptr) * uVar160;
              uVar109 = (uint)((int)uVar161 < stack_node[0xa3].ptr._4_4_) *
                        stack_node[0xa3].ptr._4_4_ |
                        ((int)uVar161 >= stack_node[0xa3].ptr._4_4_) * uVar161;
              uVar170 = (uint)((int)fVar132 < (int)fVar146) * (int)fVar146 |
                        (uint)((int)fVar132 >= (int)fVar146) * (int)fVar132;
              uVar173 = (uint)((int)fVar140 < (int)fVar149) * (int)fVar149 |
                        (uint)((int)fVar140 >= (int)fVar149) * (int)fVar140;
              uVar175 = (uint)((int)fVar142 < (int)fVar151) * (int)fVar151 |
                        (uint)((int)fVar142 >= (int)fVar151) * (int)fVar142;
              uVar177 = (uint)((int)fVar144 < (int)fVar153) * (int)fVar153 |
                        (uint)((int)fVar144 >= (int)fVar153) * (int)fVar144;
              uVar31 = (uint)((int)fVar122 < (int)fVar162) * (int)fVar162 |
                       (uint)((int)fVar122 >= (int)fVar162) * (int)fVar122;
              uVar159 = (uint)((int)fVar128 < (int)fVar166) * (int)fVar166 |
                        (uint)((int)fVar128 >= (int)fVar166) * (int)fVar128;
              uVar160 = (uint)((int)fVar130 < (int)fVar167) * (int)fVar167 |
                        (uint)((int)fVar130 >= (int)fVar167) * (int)fVar130;
              uVar161 = (uint)((int)fVar129 < (int)fVar131) * (int)fVar131 |
                        (uint)((int)fVar129 >= (int)fVar131) * (int)fVar129;
              uVar31 = ((int)uVar170 < (int)uVar31) * uVar170 |
                       ((int)uVar170 >= (int)uVar31) * uVar31;
              uVar159 = ((int)uVar173 < (int)uVar159) * uVar173 |
                        ((int)uVar173 >= (int)uVar159) * uVar159;
              uVar160 = ((int)uVar175 < (int)uVar160) * uVar175 |
                        ((int)uVar175 >= (int)uVar160) * uVar160;
              uVar161 = ((int)uVar177 < (int)uVar161) * uVar177 |
                        ((int)uVar177 >= (int)uVar161) * uVar161;
              uVar170 = (uint)((int)fVar147 < (int)fVar133) * (int)fVar133 |
                        (uint)((int)fVar147 >= (int)fVar133) * (int)fVar147;
              uVar173 = (uint)((int)fVar150 < (int)fVar141) * (int)fVar141 |
                        (uint)((int)fVar150 >= (int)fVar141) * (int)fVar150;
              uVar175 = (uint)((int)fVar152 < (int)fVar143) * (int)fVar143 |
                        (uint)((int)fVar152 >= (int)fVar143) * (int)fVar152;
              uVar177 = (uint)((int)fVar118 < (int)fVar145) * (int)fVar145 |
                        (uint)((int)fVar118 >= (int)fVar145) * (int)fVar118;
              uVar170 = (uint)((int)stack_node[0xa4].ptr < (int)uVar170) * (int)stack_node[0xa4].ptr
                        | ((int)stack_node[0xa4].ptr >= (int)uVar170) * uVar170;
              uVar173 = (uint)(stack_node[0xa4].ptr._4_4_ < (int)uVar173) *
                        stack_node[0xa4].ptr._4_4_ |
                        (stack_node[0xa4].ptr._4_4_ >= (int)uVar173) * uVar173;
              uVar175 = (uint)((int)stack_node[0xa5].ptr < (int)uVar175) * (int)stack_node[0xa5].ptr
                        | ((int)stack_node[0xa5].ptr >= (int)uVar175) * uVar175;
              uVar177 = (uint)(stack_node[0xa5].ptr._4_4_ < (int)uVar177) *
                        stack_node[0xa5].ptr._4_4_ |
                        (stack_node[0xa5].ptr._4_4_ >= (int)uVar177) * uVar177;
              auVar158._4_4_ =
                   -(uint)((float)(((int)uVar107 < (int)uVar117) * uVar117 |
                                  ((int)uVar107 >= (int)uVar117) * uVar107) <=
                          (float)(((int)uVar159 < (int)uVar173) * uVar159 |
                                 ((int)uVar159 >= (int)uVar173) * uVar173));
              auVar158._0_4_ =
                   -(uint)((float)(((int)uVar106 < (int)uVar111) * uVar111 |
                                  ((int)uVar106 >= (int)uVar111) * uVar106) <=
                          (float)(((int)uVar31 < (int)uVar170) * uVar31 |
                                 ((int)uVar31 >= (int)uVar170) * uVar170));
              auVar158._8_4_ =
                   -(uint)((float)(((int)uVar108 < (int)uVar119) * uVar119 |
                                  ((int)uVar108 >= (int)uVar119) * uVar108) <=
                          (float)(((int)uVar160 < (int)uVar175) * uVar160 |
                                 ((int)uVar160 >= (int)uVar175) * uVar175));
              auVar158._12_4_ =
                   -(uint)((float)(((int)uVar109 < (int)uVar121) * uVar121 |
                                  ((int)uVar109 >= (int)uVar121) * uVar109) <=
                          (float)(((int)uVar161 < (int)uVar177) * uVar161 |
                                 ((int)uVar161 >= (int)uVar177) * uVar177));
              uVar31 = movmskps((int)stack_node[0xab].ptr,auVar158);
              stack_node[0xab].ptr = (size_t)uVar31;
              RVar35 = RVar34;
              if (uVar31 != 0) {
                RVar35 = *(RTCRayQueryContext *)((long)RVar39 + lVar4 * 8);
                if (RVar34 != (RTCRayQueryContext)0x8) {
                  *pRVar30 = RVar34;
                  pRVar30[1] = RVar26;
                  pRVar30 = pRVar30 + 2;
                }
                RVar26 = (RTCRayQueryContext)(stack_node[0xab].ptr & 0xff);
              }
              uVar1 = uVar36 - 1;
              uVar36 = uVar36 & uVar1;
              RVar34 = RVar35;
            } while (uVar36 != 0);
            pRVar32 = (RTCRayQueryContext *)
                      CONCAT71((int7)(uVar1 >> 8),RVar35 != (RTCRayQueryContext)0x8);
            RVar39 = RVar35;
          }
        } while ((char)pRVar32 != '\0');
      }
      uVar36 = 0;
      goto LAB_002ad058;
    }
    goto LAB_002ad069;
  }
  auVar112 = *(undefined1 (*) [16])(ray + 0x80);
  local_1788 = -(uint)(0.0 <= auVar112._0_4_ && (valid_i->field_0).i[0] == -1);
  uStack_1784 = -(uint)(0.0 <= auVar112._4_4_ && (valid_i->field_0).i[1] == -1);
  uStack_1780 = -(uint)(0.0 <= auVar112._8_4_ && (valid_i->field_0).i[2] == -1);
  uStack_177c = -(uint)(0.0 <= auVar112._12_4_ && (valid_i->field_0).i[3] == -1);
  auVar12._4_4_ = uStack_1784;
  auVar12._0_4_ = local_1788;
  auVar12._8_4_ = uStack_1780;
  auVar12._12_4_ = uStack_177c;
  uVar31 = movmskps((int)This,auVar12);
  pRVar32 = (RTCRayQueryContext *)(ulong)uVar31;
  if (uVar31 == 0) {
    return;
  }
  fVar178 = *(float *)ray;
  fVar179 = *(float *)(ray + 4);
  fVar180 = *(float *)(ray + 8);
  fVar181 = *(float *)(ray + 0xc);
  auVar148 = *(undefined1 (*) [16])(ray + 0x40);
  auVar46._4_4_ = -(uint)(ABS(auVar148._4_4_) < fVar190);
  auVar46._0_4_ = -(uint)(ABS(auVar148._0_4_) < fVar189);
  auVar46._8_4_ = -(uint)(ABS(auVar148._8_4_) < fVar191);
  auVar46._12_4_ = -(uint)(ABS(auVar148._12_4_) < fVar192);
  auVar154 = blendvps(auVar148,_DAT_01ff1d40,auVar46);
  auVar148 = *(undefined1 (*) [16])(ray + 0x60);
  auVar47._4_4_ = -(uint)(ABS(auVar148._4_4_) < fVar190);
  auVar47._0_4_ = -(uint)(ABS(auVar148._0_4_) < fVar189);
  auVar47._8_4_ = -(uint)(ABS(auVar148._8_4_) < fVar191);
  auVar47._12_4_ = -(uint)(ABS(auVar148._12_4_) < fVar192);
  auVar134 = blendvps(auVar148,_DAT_01ff1d40,auVar47);
  auVar148 = *(undefined1 (*) [16])(ray + 0x50);
  auVar123 = rcpps(in_XMM3,auVar154);
  auVar171 = maxps(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0));
  iVar182 = (int)DAT_01feb9f0;
  iVar183 = DAT_01feb9f0._4_4_;
  iVar184 = DAT_01feb9f0._8_4_;
  iVar185 = DAT_01feb9f0._12_4_;
  auVar48._4_4_ = uStack_1784;
  auVar48._0_4_ = local_1788;
  auVar48._8_4_ = uStack_1780;
  auVar48._12_4_ = uStack_177c;
  aVar187.v = (__m128)blendvps(_DAT_01feb9f0,auVar171,auVar48);
  fVar169 = auVar123._0_4_;
  fVar172 = auVar123._4_4_;
  fVar174 = auVar123._8_4_;
  fVar176 = auVar123._12_4_;
  auVar49._4_4_ = -(uint)(ABS(auVar148._4_4_) < fVar190);
  auVar49._0_4_ = -(uint)(ABS(auVar148._0_4_) < fVar189);
  auVar49._8_4_ = -(uint)(ABS(auVar148._8_4_) < fVar191);
  auVar49._12_4_ = -(uint)(ABS(auVar148._12_4_) < fVar192);
  auVar148 = blendvps(auVar148,_DAT_01ff1d40,auVar49);
  auVar112 = maxps(auVar112,ZEXT816(0));
  auVar50._4_4_ = uStack_1784;
  auVar50._0_4_ = local_1788;
  auVar50._8_4_ = uStack_1780;
  auVar50._12_4_ = uStack_177c;
  bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                 blendvps(_DAT_01feba00,auVar112,auVar50);
  auVar112 = rcpps(auVar50,auVar134);
  fVar168 = auVar112._0_4_;
  fVar93 = auVar112._4_4_;
  fVar44 = auVar112._8_4_;
  fVar120 = auVar112._12_4_;
  auVar112 = rcpps((undefined1  [16])bi_8.field_0,auVar148);
  fVar189 = auVar112._0_4_;
  fVar190 = auVar112._4_4_;
  fVar191 = auVar112._8_4_;
  fVar192 = auVar112._12_4_;
  local_1708 = *(float *)(ray + 0x10);
  fStack_1704 = *(float *)(ray + 0x14);
  fStack_1700 = *(float *)(ray + 0x18);
  fStack_16fc = *(float *)(ray + 0x1c);
  fVar189 = (1.0 - auVar148._0_4_ * fVar189) * fVar189 + fVar189;
  fVar190 = (1.0 - auVar148._4_4_ * fVar190) * fVar190 + fVar190;
  fVar191 = (1.0 - auVar148._8_4_ * fVar191) * fVar191 + fVar191;
  fVar192 = (1.0 - auVar148._12_4_ * fVar192) * fVar192 + fVar192;
  local_1718 = *(undefined8 *)(ray + 0x20);
  uStack_1710 = *(undefined8 *)(ray + 0x28);
  fVar169 = (1.0 - auVar154._0_4_ * fVar169) * fVar169 + fVar169;
  fVar172 = (1.0 - auVar154._4_4_ * fVar172) * fVar172 + fVar172;
  fVar174 = (1.0 - auVar154._8_4_ * fVar174) * fVar174 + fVar174;
  fVar176 = (1.0 - auVar154._12_4_ * fVar176) * fVar176 + fVar176;
  local_17f8._0_8_ = CONCAT44(uStack_1784,local_1788) ^ 0xffffffffffffffff;
  local_17f8._8_4_ = uStack_1780 ^ 0xffffffff;
  local_17f8._12_4_ = uStack_177c ^ 0xffffffff;
  local_16f8._0_4_ = (1.0 - auVar134._0_4_ * fVar168) * fVar168 + fVar168;
  local_16f8._4_4_ = (1.0 - auVar134._4_4_ * fVar93) * fVar93 + fVar93;
  fStack_16f0 = (1.0 - auVar134._8_4_ * fVar44) * fVar44 + fVar44;
  fStack_16ec = (1.0 - auVar134._12_4_ * fVar120) * fVar120 + fVar120;
  pNVar38 = stack_node + 2;
  stack_node[0].ptr = 0xfffffffffffffff8;
  paVar40 = &stack_near[2].field_0;
  stack_near[0].field_0 = _DAT_01feb9f0;
  stack_near[1].field_0 = aVar187;
  puVar24 = mm_lookupmask_ps;
  local_1738._8_8_ = mm_lookupmask_ps._8_8_;
  local_1738._0_8_ = mm_lookupmask_ps._0_8_;
LAB_00256c06:
  paVar40 = paVar40 + -1;
  pNVar2 = pNVar38 + -1;
  pNVar38 = pNVar38 + -1;
  bVar43 = true;
  if ((RTCRayQueryContext *)pNVar2->ptr != (RTCRayQueryContext *)&DAT_fffffffffffffff8) {
    aVar114 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar40->v;
    auVar51._4_4_ = -(uint)(aVar114.v[1] < (float)bi_8.field_0.i[1]);
    auVar51._0_4_ = -(uint)(aVar114.v[0] < (float)bi_8.field_0.i[0]);
    auVar51._8_4_ = -(uint)(aVar114.v[2] < (float)bi_8.field_0.i[2]);
    auVar51._12_4_ = -(uint)(aVar114.v[3] < (float)bi_8.field_0.i[3]);
    uVar31 = movmskps((int)puVar24,auVar51);
    puVar24 = (undefined1 *)(ulong)uVar31;
    pRVar30 = (RTCRayQueryContext *)pNVar2->ptr;
    if (uVar31 != 0) {
      do {
        if (((ulong)pRVar30 & 8) != 0) {
          if (pRVar30 == (RTCRayQueryContext *)&DAT_fffffffffffffff8) goto LAB_00256d8f;
          auVar53._4_4_ = -(uint)(aVar114.v[1] < (float)bi_8.field_0.i[1]);
          auVar53._0_4_ = -(uint)(aVar114.v[0] < (float)bi_8.field_0.i[0]);
          auVar53._8_4_ = -(uint)(aVar114.v[2] < (float)bi_8.field_0.i[2]);
          auVar53._12_4_ = -(uint)(aVar114.v[3] < (float)bi_8.field_0.i[3]);
          uVar31 = movmskps((int)puVar24,auVar53);
          puVar24 = (undefined1 *)(ulong)uVar31;
          if (uVar31 != 0) {
            uVar25 = (ulong)((uint)pRVar30 & 0xf) - 8;
            uVar36 = uVar25;
            auVar55 = local_17f8;
            if (uVar25 == 0) goto LAB_00256f3d;
            auVar9._8_4_ = 0xffffffff;
            auVar9._0_8_ = 0xffffffffffffffff;
            auVar9._12_4_ = 0xffffffff;
            local_1728 = local_17f8 ^ auVar9;
            uVar41 = 1;
            local_1778 = fVar169;
            fStack_1774 = fVar172;
            fStack_1770 = fVar174;
            fStack_176c = fVar176;
            local_1768 = fVar189;
            fStack_1764 = fVar190;
            fStack_1760 = fVar191;
            fStack_175c = fVar192;
            local_1758 = aVar187;
            local_1748 = fVar178;
            fStack_1744 = fVar179;
            fStack_1740 = fVar180;
            fStack_173c = fVar181;
            goto LAB_00256e06;
          }
          break;
        }
        aVar95.i[1] = iVar183;
        aVar95.i[0] = iVar182;
        aVar95.i[2] = iVar184;
        aVar95.i[3] = iVar185;
        pRVar28 = (RTCRayQueryContext *)0x8;
        pRVar33 = (RTCRayQueryContext *)0x0;
        do {
          pRVar32 = *(RTCRayQueryContext **)
                     (((ulong)pRVar30 & 0xfffffffffffffff0) + (long)pRVar33 * 8);
          pRVar29 = pRVar28;
          aVar114 = aVar95;
          if (pRVar32 != (RTCRayQueryContext *)0x8) {
            fVar168 = (float)pRVar30[4].instID[(long)pRVar33];
            fVar93 = (float)pRVar30[6].instID[(long)pRVar33];
            fVar44 = (float)pRVar30[8].instID[(long)pRVar33];
            fVar120 = (float)pRVar30[10].instID[(long)pRVar33];
            fVar122 = (fVar168 - fVar178) * fVar169;
            fVar128 = (fVar168 - fVar179) * fVar172;
            fVar129 = (fVar168 - fVar180) * fVar174;
            fVar130 = (fVar168 - fVar181) * fVar176;
            fVar132 = (fVar44 - local_1708) * fVar189;
            fVar140 = (fVar44 - fStack_1704) * fVar190;
            fVar142 = (fVar44 - fStack_1700) * fVar191;
            fVar144 = (fVar44 - fStack_16fc) * fVar192;
            fVar168 = (float)pRVar30[0xc].instID[(long)pRVar33];
            fVar146 = (fVar168 - (float)local_1718) * (float)local_16f8._0_4_;
            fVar149 = (fVar168 - local_1718._4_4_) * (float)local_16f8._4_4_;
            fVar151 = (fVar168 - (float)uStack_1710) * fStack_16f0;
            fVar153 = (fVar168 - uStack_1710._4_4_) * fStack_16ec;
            fVar44 = (fVar93 - fVar178) * fVar169;
            fVar90 = (fVar93 - fVar179) * fVar172;
            fVar92 = (fVar93 - fVar180) * fVar174;
            fVar93 = (fVar93 - fVar181) * fVar176;
            fVar110 = (fVar120 - local_1708) * fVar189;
            fVar116 = (fVar120 - fStack_1704) * fVar190;
            fVar118 = (fVar120 - fStack_1700) * fVar191;
            fVar120 = (fVar120 - fStack_16fc) * fVar192;
            fVar168 = (float)pRVar30[0xe].instID[(long)pRVar33];
            fVar162 = (fVar168 - (float)local_1718) * (float)local_16f8._0_4_;
            fVar166 = (fVar168 - local_1718._4_4_) * (float)local_16f8._4_4_;
            fVar167 = (fVar168 - (float)uStack_1710) * fStack_16f0;
            fVar168 = (fVar168 - uStack_1710._4_4_) * fStack_16ec;
            uVar31 = (uint)((int)fVar44 < (int)fVar122) * (int)fVar44 |
                     (uint)((int)fVar44 >= (int)fVar122) * (int)fVar122;
            uVar159 = (uint)((int)fVar90 < (int)fVar128) * (int)fVar90 |
                      (uint)((int)fVar90 >= (int)fVar128) * (int)fVar128;
            uVar160 = (uint)((int)fVar92 < (int)fVar129) * (int)fVar92 |
                      (uint)((int)fVar92 >= (int)fVar129) * (int)fVar129;
            uVar161 = (uint)((int)fVar93 < (int)fVar130) * (int)fVar93 |
                      (uint)((int)fVar93 >= (int)fVar130) * (int)fVar130;
            uVar170 = (uint)((int)fVar110 < (int)fVar132) * (int)fVar110 |
                      (uint)((int)fVar110 >= (int)fVar132) * (int)fVar132;
            uVar173 = (uint)((int)fVar116 < (int)fVar140) * (int)fVar116 |
                      (uint)((int)fVar116 >= (int)fVar140) * (int)fVar140;
            uVar175 = (uint)((int)fVar118 < (int)fVar142) * (int)fVar118 |
                      (uint)((int)fVar118 >= (int)fVar142) * (int)fVar142;
            uVar177 = (uint)((int)fVar120 < (int)fVar144) * (int)fVar120 |
                      (uint)((int)fVar120 >= (int)fVar144) * (int)fVar144;
            uVar170 = ((int)uVar170 < (int)uVar31) * uVar31 |
                      ((int)uVar170 >= (int)uVar31) * uVar170;
            uVar173 = ((int)uVar173 < (int)uVar159) * uVar159 |
                      ((int)uVar173 >= (int)uVar159) * uVar173;
            uVar175 = ((int)uVar175 < (int)uVar160) * uVar160 |
                      ((int)uVar175 >= (int)uVar160) * uVar175;
            uVar177 = ((int)uVar177 < (int)uVar161) * uVar161 |
                      ((int)uVar177 >= (int)uVar161) * uVar177;
            uVar31 = (uint)((int)fVar162 < (int)fVar146) * (int)fVar162 |
                     (uint)((int)fVar162 >= (int)fVar146) * (int)fVar146;
            uVar159 = (uint)((int)fVar166 < (int)fVar149) * (int)fVar166 |
                      (uint)((int)fVar166 >= (int)fVar149) * (int)fVar149;
            uVar160 = (uint)((int)fVar167 < (int)fVar151) * (int)fVar167 |
                      (uint)((int)fVar167 >= (int)fVar151) * (int)fVar151;
            uVar161 = (uint)((int)fVar168 < (int)fVar153) * (int)fVar168 |
                      (uint)((int)fVar168 >= (int)fVar153) * (int)fVar153;
            auVar155._0_4_ =
                 ((int)uVar31 < (int)uVar170) * uVar170 | ((int)uVar31 >= (int)uVar170) * uVar31;
            auVar155._4_4_ =
                 ((int)uVar159 < (int)uVar173) * uVar173 | ((int)uVar159 >= (int)uVar173) * uVar159;
            auVar155._8_4_ =
                 ((int)uVar160 < (int)uVar175) * uVar175 | ((int)uVar160 >= (int)uVar175) * uVar160;
            auVar155._12_4_ =
                 ((int)uVar161 < (int)uVar177) * uVar177 | ((int)uVar161 >= (int)uVar177) * uVar161;
            uVar31 = (uint)((int)fVar44 < (int)fVar122) * (int)fVar122 |
                     (uint)((int)fVar44 >= (int)fVar122) * (int)fVar44;
            uVar159 = (uint)((int)fVar90 < (int)fVar128) * (int)fVar128 |
                      (uint)((int)fVar90 >= (int)fVar128) * (int)fVar90;
            uVar160 = (uint)((int)fVar92 < (int)fVar129) * (int)fVar129 |
                      (uint)((int)fVar92 >= (int)fVar129) * (int)fVar92;
            uVar161 = (uint)((int)fVar93 < (int)fVar130) * (int)fVar130 |
                      (uint)((int)fVar93 >= (int)fVar130) * (int)fVar93;
            uVar170 = (uint)((int)fVar110 < (int)fVar132) * (int)fVar132 |
                      (uint)((int)fVar110 >= (int)fVar132) * (int)fVar110;
            uVar173 = (uint)((int)fVar116 < (int)fVar140) * (int)fVar140 |
                      (uint)((int)fVar116 >= (int)fVar140) * (int)fVar116;
            uVar175 = (uint)((int)fVar118 < (int)fVar142) * (int)fVar142 |
                      (uint)((int)fVar118 >= (int)fVar142) * (int)fVar118;
            uVar177 = (uint)((int)fVar120 < (int)fVar144) * (int)fVar144 |
                      (uint)((int)fVar120 >= (int)fVar144) * (int)fVar120;
            uVar31 = ((int)uVar31 < (int)uVar170) * uVar31 | ((int)uVar31 >= (int)uVar170) * uVar170
            ;
            uVar159 = ((int)uVar159 < (int)uVar173) * uVar159 |
                      ((int)uVar159 >= (int)uVar173) * uVar173;
            uVar160 = ((int)uVar160 < (int)uVar175) * uVar160 |
                      ((int)uVar160 >= (int)uVar175) * uVar175;
            uVar161 = ((int)uVar161 < (int)uVar177) * uVar161 |
                      ((int)uVar161 >= (int)uVar177) * uVar177;
            uVar170 = (uint)((int)fVar162 < (int)fVar146) * (int)fVar146 |
                      (uint)((int)fVar162 >= (int)fVar146) * (int)fVar162;
            uVar173 = (uint)((int)fVar166 < (int)fVar149) * (int)fVar149 |
                      (uint)((int)fVar166 >= (int)fVar149) * (int)fVar166;
            uVar175 = (uint)((int)fVar167 < (int)fVar151) * (int)fVar151 |
                      (uint)((int)fVar167 >= (int)fVar151) * (int)fVar167;
            uVar177 = (uint)((int)fVar168 < (int)fVar153) * (int)fVar153 |
                      (uint)((int)fVar168 >= (int)fVar153) * (int)fVar168;
            iVar5 = aVar187.i[0];
            iVar6 = aVar187.i[1];
            iVar7 = aVar187.i[2];
            iVar8 = aVar187.i[3];
            uVar170 = (uint)(bi_8.field_0.i[0] < (int)uVar170) * bi_8.field_0.i[0] |
                      (bi_8.field_0.i[0] >= (int)uVar170) * uVar170;
            uVar173 = (uint)(bi_8.field_0.i[1] < (int)uVar173) * bi_8.field_0.i[1] |
                      (bi_8.field_0.i[1] >= (int)uVar173) * uVar173;
            uVar175 = (uint)(bi_8.field_0.i[2] < (int)uVar175) * bi_8.field_0.i[2] |
                      (bi_8.field_0.i[2] >= (int)uVar175) * uVar175;
            uVar177 = (uint)(bi_8.field_0.i[3] < (int)uVar177) * bi_8.field_0.i[3] |
                      (bi_8.field_0.i[3] >= (int)uVar177) * uVar177;
            auVar52._4_4_ =
                 -(uint)((float)((uint)((int)auVar155._4_4_ < iVar6) * iVar6 |
                                ((int)auVar155._4_4_ >= iVar6) * auVar155._4_4_) <=
                        (float)(((int)uVar159 < (int)uVar173) * uVar159 |
                               ((int)uVar159 >= (int)uVar173) * uVar173));
            auVar52._0_4_ =
                 -(uint)((float)((uint)((int)auVar155._0_4_ < iVar5) * iVar5 |
                                ((int)auVar155._0_4_ >= iVar5) * auVar155._0_4_) <=
                        (float)(((int)uVar31 < (int)uVar170) * uVar31 |
                               ((int)uVar31 >= (int)uVar170) * uVar170));
            auVar52._8_4_ =
                 -(uint)((float)((uint)((int)auVar155._8_4_ < iVar7) * iVar7 |
                                ((int)auVar155._8_4_ >= iVar7) * auVar155._8_4_) <=
                        (float)(((int)uVar160 < (int)uVar175) * uVar160 |
                               ((int)uVar160 >= (int)uVar175) * uVar175));
            auVar52._12_4_ =
                 -(uint)((float)((uint)((int)auVar155._12_4_ < iVar8) * iVar8 |
                                ((int)auVar155._12_4_ >= iVar8) * auVar155._12_4_) <=
                        (float)(((int)uVar161 < (int)uVar177) * uVar161 |
                               ((int)uVar161 >= (int)uVar177) * uVar177));
            uVar31 = movmskps((int)valid_i,auVar52);
            valid_i = (vint<4> *)(ulong)uVar31;
            if ((uVar31 != 0) &&
               (auVar113._4_4_ = iVar183, auVar113._0_4_ = iVar182, auVar113._8_4_ = iVar184,
               auVar113._12_4_ = iVar185,
               aVar114 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         blendvps(auVar113,auVar155,auVar52), pRVar29 = pRVar32,
               pRVar28 != (RTCRayQueryContext *)0x8)) {
              pNVar38->ptr = (size_t)pRVar28;
              pNVar38 = pNVar38 + 1;
              *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar40->v = aVar95;
              paVar40 = paVar40 + 1;
            }
          }
        } while ((pRVar32 != (RTCRayQueryContext *)0x8) &&
                (pRVar32 = (RTCRayQueryContext *)((long)pRVar33->instID + 1),
                bVar42 = pRVar33 < (RTCRayQueryContext *)0x3, pRVar28 = pRVar29, pRVar33 = pRVar32,
                aVar95 = aVar114, bVar42));
        puVar24 = (undefined1 *)pRVar30;
        pRVar30 = pRVar29;
      } while (pRVar29 != (RTCRayQueryContext *)0x8);
    }
    goto LAB_00256d8c;
  }
  goto LAB_00256d8f;
  while( true ) {
    uVar36 = stack_node[0xab].ptr + 1;
    stack_node[0xd0].ptr._4_4_ = uVar159;
    stack_node[0xd0].ptr._0_4_ = uVar31;
    stack_node[0xd1].ptr._0_4_ = auVar88._8_4_;
    stack_node[0xd1].ptr._4_4_ = auVar88._12_4_;
    bVar43 = stack_node[0xaa].ptr <= stack_node[0xab].ptr;
    stack_node[0xab].ptr = uVar36;
    if (bVar43) break;
LAB_002acead:
    stack_node[0xb8].ptr._4_4_ =
         *(uint *)((((ulong)RVar39 & 0xfffffffffffffff0) - 8) + stack_node[0xab].ptr * 8);
    stack_node[0xb9].ptr =
         (size_t)(context->scene->geometries).items[stack_node[0xb8].ptr._4_4_].ptr;
    uVar31 = ((Geometry *)stack_node[0xb9].ptr)->mask;
    auVar104._0_4_ = -(uint)((uVar31 & *(uint *)(ray + 0x90)) == 0);
    auVar104._4_4_ = -(uint)((uVar31 & *(uint *)(ray + 0x94)) == 0);
    auVar104._8_4_ = -(uint)((uVar31 & *(uint *)(ray + 0x98)) == 0);
    auVar104._12_4_ = -(uint)((uVar31 & *(uint *)(ray + 0x9c)) == 0);
    stack_node._1872_16_ = ~auVar104 & stack_node._1664_16_;
    uVar170 = movmskps((int)pRVar32,stack_node._1872_16_);
    pRVar32 = (RTCRayQueryContext *)(ulong)uVar170;
    uVar31 = (uint)stack_node[0xce].ptr;
    uVar159 = stack_node[0xce].ptr._4_4_;
    uVar160 = (uint)stack_node[0xcf].ptr;
    uVar161 = stack_node[0xcf].ptr._4_4_;
    if (uVar170 != 0) {
      stack_node[0xb5].ptr._0_4_ =
           *(undefined4 *)((((ulong)RVar39 & 0xfffffffffffffff0) - 4) + stack_node[0xab].ptr * 8);
      stack_node[0xb3].ptr = (size_t)(stack_node + 0xea);
      stack_node[0xb4].ptr = (size_t)((Geometry *)stack_node[0xb9].ptr)->userPtr;
      pRVar32 = context->user;
      stack_node[0xb8].ptr._0_4_ = 4;
      stack_node[0xba].ptr = 0;
      stack_node[0xbb].ptr = (size_t)context->args;
      p_Var27 = ((RTCIntersectArguments *)stack_node[0xbb].ptr)->intersect;
      if (p_Var27 == (RTCIntersectFunctionN)0x0) {
        p_Var27 = (RTCIntersectFunctionN)
                  (((Geometry *)(stack_node[0xb9].ptr + 0x60))->super_RefCount).refCounter.
                  super___atomic_base<unsigned_long>._M_i;
      }
      stack_node[0x9b].ptr = 0x2acf8a;
      stack_node[0xb6].ptr = (size_t)pRVar32;
      stack_node[0xb7].ptr = (size_t)ray;
      stack_node[0xb9].ptr = (*p_Var27)((RTCIntersectFunctionNArguments *)(stack_node + 0xb3));
      uVar31 = -(uint)(*(float *)(stack_node[0xa9].ptr + 0x80) < 0.0);
      uVar159 = -(uint)(*(float *)(stack_node[0xa9].ptr + 0x84) < 0.0);
      uVar160 = -(uint)(*(float *)(stack_node[0xa9].ptr + 0x88) < 0.0);
      uVar161 = -(uint)(*(float *)(stack_node[0xa9].ptr + 0x8c) < 0.0);
      context = (RayQueryContext *)stack_node[0xa8];
      ray = (RayK<4> *)stack_node[0xa9];
      auVar112 = stack_node._1632_16_;
      fVar178 = (float)stack_node[0xca].ptr;
      fVar179 = stack_node[0xca].ptr._4_4_;
      fVar180 = (float)stack_node[0xcb].ptr;
      fVar181 = stack_node[0xcb].ptr._4_4_;
      fVar169 = (float)stack_node[200].ptr;
      fVar172 = stack_node[200].ptr._4_4_;
      fVar174 = (float)stack_node[0xc9].ptr;
      fVar176 = stack_node[0xc9].ptr._4_4_;
      fVar168 = (float)stack_node[0xc6].ptr;
      fVar93 = stack_node[0xc6].ptr._4_4_;
      fVar44 = (float)stack_node[199].ptr;
      fVar120 = stack_node[199].ptr._4_4_;
      fVar189 = (float)stack_node[0xc4].ptr;
      fVar190 = stack_node[0xc4].ptr._4_4_;
      fVar191 = (float)stack_node[0xc5].ptr;
      fVar192 = stack_node[0xc5].ptr._4_4_;
      auVar123 = stack_node._1552_16_;
      fVar90 = (float)stack_node[0xc0].ptr;
      fVar92 = stack_node[0xc0].ptr._4_4_;
      fVar110 = (float)stack_node[0xc1].ptr;
      fVar116 = stack_node[0xc1].ptr._4_4_;
    }
    uVar31 = ~uVar31 & (uint)stack_node[0xd0].ptr;
    uVar159 = ~uVar159 & stack_node[0xd0].ptr._4_4_;
    auVar88._0_8_ = CONCAT44(uVar159,uVar31);
    auVar88._8_4_ = ~uVar160 & (uint)stack_node[0xd1].ptr;
    auVar88._12_4_ = ~uVar161 & stack_node[0xd1].ptr._4_4_;
    iVar182 = movmskps((int)stack_node[0xb9].ptr,auVar88);
    uVar36 = CONCAT44((int)(stack_node[0xb9].ptr >> 0x20),iVar182);
    if (iVar182 == 0) break;
  }
  auVar156._0_8_ = auVar88._0_8_ ^ 0xffffffffffffffff;
  auVar156._8_4_ = auVar88._8_4_ ^ 0xffffffff;
  auVar156._12_4_ = auVar88._12_4_ ^ 0xffffffff;
LAB_002ad024:
  auVar156 = auVar112 | auVar156;
  stack_node[0x9c].ptr._0_4_ = ~auVar156._0_4_ & (uint)stack_node[0x9c].ptr;
  stack_node[0x9c].ptr._4_4_ = ~auVar156._4_4_ & stack_node[0x9c].ptr._4_4_;
  stack_node[0x9d].ptr._0_4_ = ~auVar156._8_4_ & (uint)stack_node[0x9d].ptr;
  stack_node[0x9d].ptr._4_4_ = ~auVar156._12_4_ & stack_node[0x9d].ptr._4_4_;
  iVar182 = movmskps((int)uVar36,stack_node._1248_16_);
  if (iVar182 == 0) {
    uVar36 = CONCAT71((int7)(CONCAT44((int)(uVar36 >> 0x20),iVar182) >> 8),1);
  }
  else {
    stack_node._1312_16_ = blendvps(stack_node._1312_16_,_DAT_01feba00,auVar156);
    uVar36 = 0;
  }
LAB_002ad058:
  pRVar32 = pRVar30;
  if ((char)uVar36 != '\0') goto LAB_002ad069;
  goto LAB_002acc5f;
LAB_002ad069:
  if (stack_node[0xa7].ptr == 0) {
    auVar89._0_4_ = -(uint)((int)stack_node[0xbc].ptr == -1);
    auVar89._4_4_ = -(uint)(stack_node[0xbc].ptr._4_4_ == -1);
    auVar89._8_4_ = -(uint)((int)stack_node[0xbd].ptr == -1);
    auVar89._12_4_ = -(uint)(stack_node[0xbd].ptr._4_4_ == -1);
    auVar112 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01feba00,auVar89 & auVar156);
    *(undefined1 (*) [16])(ray + 0x80) = auVar112;
    return;
  }
  goto LAB_002ac870;
  while( true ) {
    uVar36 = uVar41 + 1;
    local_1728._4_4_ = uVar159;
    local_1728._0_4_ = uVar170;
    local_1728._8_4_ = auVar54._8_4_;
    local_1728._12_4_ = auVar54._12_4_;
    bVar43 = uVar25 <= uVar41;
    uVar41 = uVar36;
    if (bVar43) break;
LAB_00256e06:
    local_17d0.geomID = *(uint *)((((ulong)pRVar30 & 0xfffffffffffffff0) - 8) + uVar41 * 8);
    local_17a0 = (context->scene->geometries).items[local_17d0.geomID].ptr;
    uVar31 = local_17a0->mask;
    auVar96._0_4_ = -(uint)((uVar31 & *(uint *)(ray + 0x90)) == 0);
    auVar96._4_4_ = -(uint)((uVar31 & *(uint *)(ray + 0x94)) == 0);
    auVar96._8_4_ = -(uint)((uVar31 & *(uint *)(ray + 0x98)) == 0);
    auVar96._12_4_ = -(uint)((uVar31 & *(uint *)(ray + 0x9c)) == 0);
    mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)(~auVar96 & local_1728);
    uVar170 = movmskps((int)pRVar32,(undefined1  [16])mask.field_0);
    pRVar32 = (RTCRayQueryContext *)(ulong)uVar170;
    uVar31 = local_1738._0_4_;
    uVar159 = local_1738._4_4_;
    uVar160 = local_1738._8_4_;
    uVar161 = local_1738._12_4_;
    if (uVar170 != 0) {
      local_17d0.primID = *(uint *)((((ulong)pRVar30 & 0xfffffffffffffff0) - 4) + uVar41 * 8);
      local_17d0.valid = (int *)&mask;
      local_17d0.geometryUserPtr = local_17a0->userPtr;
      pRVar32 = context->user;
      local_17d0.N = 4;
      local_1798 = 0;
      local_1790 = context->args;
      p_Var27 = local_1790->intersect;
      if (p_Var27 == (RTCIntersectFunctionN)0x0) {
        p_Var27 = (RTCIntersectFunctionN)
                  local_17a0[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      }
      valid_i = (vint<4> *)&local_17d0;
      local_17d0.context = pRVar32;
      local_17d0.rayhit = (RTCRayHitN *)ray;
      local_17a0 = (Geometry *)(*p_Var27)((RTCIntersectFunctionNArguments *)valid_i);
      uVar31 = -(uint)(*(float *)(ray + 0x80) < 0.0);
      uVar159 = -(uint)(*(float *)(ray + 0x84) < 0.0);
      uVar160 = -(uint)(*(float *)(ray + 0x88) < 0.0);
      uVar161 = -(uint)(*(float *)(ray + 0x8c) < 0.0);
      iVar182 = 0x7f800000;
      iVar183 = 0x7f800000;
      iVar184 = 0x7f800000;
      iVar185 = 0x7f800000;
      fVar169 = local_1778;
      fVar172 = fStack_1774;
      fVar174 = fStack_1770;
      fVar176 = fStack_176c;
      fVar178 = local_1748;
      fVar179 = fStack_1744;
      fVar180 = fStack_1740;
      fVar181 = fStack_173c;
      aVar187 = local_1758;
      fVar189 = local_1768;
      fVar190 = fStack_1764;
      fVar191 = fStack_1760;
      fVar192 = fStack_175c;
    }
    uVar170 = ~uVar31 & local_1728._0_4_;
    uVar159 = ~uVar159 & local_1728._4_4_;
    auVar54._0_8_ = CONCAT44(uVar159,uVar170);
    auVar54._8_4_ = ~uVar160 & local_1728._8_4_;
    auVar54._12_4_ = ~uVar161 & local_1728._12_4_;
    uVar31 = movmskps((int)local_17a0,auVar54);
    uVar36 = (ulong)uVar31;
    if (uVar31 == 0) break;
  }
  auVar55._0_8_ = auVar54._0_8_ ^ 0xffffffffffffffff;
  auVar55._8_4_ = auVar54._8_4_ ^ 0xffffffff;
  auVar55._12_4_ = auVar54._12_4_ ^ 0xffffffff;
LAB_00256f3d:
  bVar43 = true;
  local_17f8 = local_17f8 | auVar55;
  uVar31 = movmskps((int)uVar36,local_17f8);
  puVar24 = (undefined1 *)(ulong)uVar31;
  if (uVar31 != 0xf) {
    bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                   blendvps((undefined1  [16])bi_8.field_0,_DAT_01feba00,local_17f8);
LAB_00256d8c:
    bVar43 = false;
  }
LAB_00256d8f:
  if (bVar43) {
    auVar56._0_4_ = local_1788 & local_17f8._0_4_;
    auVar56._4_4_ = uStack_1784 & local_17f8._4_4_;
    auVar56._8_4_ = uStack_1780 & local_17f8._8_4_;
    auVar56._12_4_ = uStack_177c & local_17f8._12_4_;
    auVar112 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01feba00,auVar56);
    *(undefined1 (*) [16])(ray + 0x80) = auVar112;
    return;
  }
  goto LAB_00256c06;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }